

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothubtransport_amqp_twin_messenger.c
# Opt level: O1

char * generate_unique_id(void)

{
  UNIQUEID_RESULT UVar1;
  char *uid;
  LOGGER_LOG p_Var2;
  
  uid = (char *)calloc(1,0x26);
  if (uid == (char *)0x0) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_twin_messenger.c"
                ,"generate_unique_id",0x15d,1,
                "Failed generating an unique tag (calloc failed), size:%zu",0x26);
      return (char *)0x0;
    }
  }
  else {
    UVar1 = UniqueId_Generate(uid,0x25);
    if (UVar1 == UNIQUEID_OK) {
      return uid;
    }
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_twin_messenger.c"
                ,"generate_unique_id",0x164,1,
                "Failed generating an unique tag (UniqueId_Generate failed)");
    }
    free(uid);
  }
  return (char *)0x0;
}

Assistant:

static char* generate_unique_id(void)
{
    char* result;

    size_t calloc_size = safe_multiply_size_t(sizeof(char), safe_add_size_t(UNIQUE_ID_BUFFER_SIZE, 1));
    if (calloc_size == SIZE_MAX ||
        (result = (char*)calloc(1, calloc_size)) == NULL)
    {
        LogError("Failed generating an unique tag (calloc failed), size:%zu", calloc_size);
        result = NULL;
    }
    else
    {
        if (UniqueId_Generate(result, UNIQUE_ID_BUFFER_SIZE) != UNIQUEID_OK)
        {
            LogError("Failed generating an unique tag (UniqueId_Generate failed)");
            free(result);
            result = NULL;
        }
    }

    return result;
}